

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

cio_http_cb_return data_callback_write_response(cio_http_client *c,char *at,size_t length)

{
  cio_http_location_handler *pcVar1;
  dummy_handler *dh;
  cio_http_location_handler *handler;
  size_t length_local;
  char *at_local;
  cio_http_client *c_local;
  
  pcVar1 = c->current_handler;
  cio_write_buffer_const_element_init((cio_write_buffer *)&pcVar1[1].on_path,"Hello World!",0xd);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)(pcVar1 + 1),(cio_write_buffer *)&pcVar1[1].on_path);
  (*c->write_response)
            (c,CIO_HTTP_STATUS_NOT_FOUND,(cio_write_buffer *)(pcVar1 + 1),
             (cio_response_written_cb_t)0x0);
  return CIO_HTTP_CB_SUCCESS;
}

Assistant:

static enum cio_http_cb_return data_callback_write_response(struct cio_http_client *c, const char *at, size_t length)
{
	(void)at;
	(void)length;

	static const char data[] = "Hello World!";
	struct cio_http_location_handler *handler = c->current_handler;
	struct dummy_handler *dh = cio_container_of(handler, struct dummy_handler, handler);
	cio_write_buffer_const_element_init(&dh->wb, data, sizeof(data));
	cio_write_buffer_queue_tail(&dh->wbh, &dh->wb);
	c->write_response(c, CIO_HTTP_STATUS_NOT_FOUND, &dh->wbh, NULL);
	return CIO_HTTP_CB_SUCCESS;
}